

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O2

ImVector_ImDrawIdx * ImVector_ImDrawIdx_ImVector_ImDrawIdxVector(ImVector_ImDrawIdx *src)

{
  ImVector<unsigned_short> *this;
  
  this = (ImVector<unsigned_short> *)ImGui::MemAlloc(0x10);
  ImVector<unsigned_short>::ImVector(this,src);
  return this;
}

Assistant:

CIMGUI_API ImVector_ImDrawIdx* ImVector_ImDrawIdx_ImVector_ImDrawIdxVector(const ImVector_ImDrawIdx src)
{
    return IM_NEW(ImVector_ImDrawIdx)(src);
}